

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_0000003c;
  char cVar2;
  char local_2a;
  char local_29;
  
  cVar2 = 'N';
  if ((*__buf & 1) != 0) {
    cVar2 = 'Y';
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
  local_29 = cVar2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_29,1);
  local_2a = '|';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2a,1);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }